

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O0

void __thiscall
ExtPubkey_DerivePubkeyTest_Test::ExtPubkey_DerivePubkeyTest_Test
          (ExtPubkey_DerivePubkeyTest_Test *this)

{
  ExtPubkey_DerivePubkeyTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ExtPubkey_DerivePubkeyTest_Test_009e1d98;
  return;
}

Assistant:

TEST(ExtPubkey, DerivePubkeyTest) {
  std::string ext_serial = "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0";
  ExtPubkey extkey = ExtPubkey(ByteData(ext_serial));
  ExtPubkey child;
  ExtPubkey child1;
  ExtPubkey child2;
  std::vector<uint32_t> path = {0, 44};

  EXPECT_NO_THROW((child = extkey.DerivePubkey(path)));
  EXPECT_STREQ("043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", child.GetData().GetHex().c_str());
  EXPECT_STREQ("tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", child.ToString().c_str());
  EXPECT_STREQ("043587cf", child.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, child.GetVersion());
  EXPECT_TRUE(child.IsValid());
  EXPECT_EQ(4, child.GetDepth());
  EXPECT_STREQ("03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", child.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e", child.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("a53a8ff3", child.GetFingerprintData().GetHex().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ("68a454a64c91bd4086e5008e843dbe1c583d193afd9bdbbcdd8afcb1bdd3cafe", child.GetPubTweakSum().GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS

  EXPECT_NO_THROW((child1 = extkey.DerivePubkey(0)));
  EXPECT_STREQ("043587cf", child1.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, child1.GetVersion());
  EXPECT_TRUE(child1.IsValid());
  EXPECT_EQ(3, child1.GetDepth());
  EXPECT_STREQ("02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3", child1.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("87ced156b5641d416892046bbd1257c492c030967868aa8dc7a7067490fa08d5", child1.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("b7665978", child1.GetFingerprintData().GetHex().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ("6a5e09c61652134b024da66a8517fe2e280c6faaa7c3a99314f60b1081410f0c", child1.GetPubTweakSum().GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS

  EXPECT_NO_THROW((child2 = child1.DerivePubkey(44)));
  EXPECT_STREQ("043587cf", child2.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, child2.GetVersion());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_EQ(4, child2.GetDepth());
  EXPECT_STREQ("03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", child2.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e", child2.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("a53a8ff3", child2.GetFingerprintData().GetHex().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ("68a454a64c91bd4086e5008e843dbe1c583d193afd9bdbbcdd8afcb1bdd3cafe", child2.GetPubTweakSum().GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS

  EXPECT_STREQ(child2.GetData().GetHex().c_str(), child.GetData().GetHex().c_str());
  EXPECT_STREQ(child2.GetVersionData().GetHex().c_str(), child.GetVersionData().GetHex().c_str());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_EQ(child2.GetDepth(), child.GetDepth());
  EXPECT_STREQ(child2.GetPubkey().GetHex().c_str(), child.GetPubkey().GetHex().c_str());
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ(child2.GetPubTweakSum().GetHex().c_str(), child.GetPubTweakSum().GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS

  EXPECT_NO_THROW((child2 = extkey.DerivePubkey("0x000000000/0x2c")));  // 0/44
  EXPECT_STREQ(child2.GetData().GetHex().c_str(), child.GetData().GetHex().c_str());
  EXPECT_STREQ(child2.GetVersionData().GetHex().c_str(), child.GetVersionData().GetHex().c_str());
  EXPECT_EQ(child2.GetVersion(), child.GetVersion());
  EXPECT_TRUE(child2.IsValid());
  EXPECT_STREQ(child2.ToString().c_str(), child.ToString().c_str());
  EXPECT_EQ(child2.GetDepth(), child.GetDepth());
  EXPECT_STREQ(child2.GetPubkey().GetHex().c_str(), child.GetPubkey().GetHex().c_str());

  EXPECT_THROW((child2 = extkey.DerivePubkey("m/1/1")), CfdException);  // master 

  EXPECT_NO_THROW((child2 = extkey.DerivePubkey("/1/1")));  // start slash

  EXPECT_THROW((child2 = extkey.DerivePubkey("1/2//3")), CfdException);  // empty number

  // KeyData
  KeyData data1 = extkey.DerivePubkeyData("0/44");
  EXPECT_STREQ("[b7665978/0/44]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", data1.ToString(false).c_str());
  EXPECT_STREQ("tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", data1.GetExtPubkey().ToString().c_str());

  KeyData data2 = extkey.DerivePubkeyData(path);
  EXPECT_STREQ("[b7665978/0/44]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", data2.ToString(false).c_str());
  EXPECT_STREQ("tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua", data2.GetExtPubkey().ToString().c_str());
}